

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QPluginParsedMetaData>::Inserter::insertOne
          (Inserter *this,qsizetype pos,QPluginParsedMetaData *t)

{
  QPluginParsedMetaData *pQVar1;
  Type TVar2;
  QPluginParsedMetaData *pQVar3;
  QCborContainerPrivate *pQVar4;
  long lVar5;
  long lVar6;
  
  pQVar3 = this->begin;
  lVar6 = this->size;
  pQVar1 = pQVar3 + lVar6;
  this->end = pQVar1;
  this->last = pQVar3 + lVar6 + -1;
  this->where = pQVar3 + pos;
  lVar5 = lVar6 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar5;
  this->sourceCopyAssign = 1;
  if (0 < lVar5) {
    pQVar4 = pQVar1[-1].data.container;
    (pQVar1->data).n = pQVar1[-1].data.n;
    (pQVar1->data).container = pQVar4;
    pQVar1[-1].data.container = (QCborContainerPrivate *)0x0;
    TVar2 = pQVar1[-1].data.t;
    pQVar1[-1].data.t = Undefined;
    (pQVar1->data).t = TVar2;
    this->size = lVar6 + 1;
    if (lVar5 != 1) {
      lVar5 = 0;
      lVar6 = 0;
      do {
        QCborValue::operator=
                  ((QCborValue *)((long)&(this->last->data).n + lVar5),
                   (QCborValue *)((long)&this->last[-1].data.n + lVar5));
        lVar6 = lVar6 + -1;
        lVar5 = lVar5 + -0x18;
      } while (lVar6 != this->move);
    }
    QCborValue::operator=((QCborValue *)this->where,&t->data);
    return;
  }
  this->sourceCopyConstruct = 1 - lVar5;
  this->move = 0;
  this->sourceCopyAssign = lVar5;
  (pQVar1->data).n = (t->data).n;
  pQVar4 = (t->data).container;
  (t->data).container = (QCborContainerPrivate *)0x0;
  (pQVar1->data).container = pQVar4;
  TVar2 = (t->data).t;
  (t->data).t = Undefined;
  (pQVar1->data).t = TVar2;
  this->size = lVar6 + 1;
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }